

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdict.cpp
# Opt level: O0

int __thiscall
CVmObjDict::getp_for_each_word(CVmObjDict *this,vm_obj_id_t self,vm_val_t *retval,uint *argc)

{
  int iVar1;
  vm_val_t *this_00;
  undefined4 *in_RCX;
  vm_val_t *in_RDX;
  vm_obj_id_t in_ESI;
  vm_val_t *in_RDI;
  for_each_word_enum_cb_ctx ctx;
  int orig_argc;
  vm_val_t *cb_val;
  CVmNativeCodeDesc *in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 uVar2;
  char *in_stack_ffffffffffffff80;
  _func_void_void_ptr_CVmHashEntry_ptr *in_stack_ffffffffffffff88;
  anon_union_8_8_cb74652f_for_val in_stack_ffffffffffffff90;
  
  if ((getp_for_each_word(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') &&
     (iVar1 = __cxa_guard_acquire(&getp_for_each_word(unsigned_int,vm_val_t*,unsigned_int*)::desc),
     iVar1 != 0)) {
    CVmNativeCodeDesc::CVmNativeCodeDesc(&getp_for_each_word::desc,1);
    __cxa_guard_release(&getp_for_each_word(unsigned_int,vm_val_t*,unsigned_int*)::desc);
  }
  if (in_RCX == (undefined4 *)0x0) {
    uVar2 = 0;
  }
  else {
    uVar2 = *in_RCX;
  }
  for_each_word_enum_cb_ctx::for_each_word_enum_cb_ctx((for_each_word_enum_cb_ctx *)0x328201);
  iVar1 = CVmObject::get_prop_check_argc
                    (in_RDI,(uint *)CONCAT44(uVar2,in_stack_ffffffffffffff50),
                     in_stack_ffffffffffffff48);
  if (iVar1 == 0) {
    CVmStack::get(0);
    this_00 = CVmStack::push();
    vm_val_t::set_obj(this_00,in_ESI);
    vm_rcdesc::init((vm_rcdesc *)&stack0xffffffffffffff70,(EVP_PKEY_CTX *)"Dict.forEachWord");
    get_ext((CVmObjDict *)in_RDI);
    CVmHashTable::safe_enum_entries
              ((CVmHashTable *)in_stack_ffffffffffffff90.native_desc,in_stack_ffffffffffffff88,
               in_stack_ffffffffffffff80);
    CVmStack::discard(2);
    vm_val_t::set_nil(in_RDX);
  }
  return 1;
}

Assistant:

int CVmObjDict::getp_for_each_word(VMG_ vm_obj_id_t self, vm_val_t *retval,
                                   uint *argc)
{
    static CVmNativeCodeDesc desc(1);
    vm_val_t *cb_val;
    int orig_argc = (argc != 0 ? *argc : 0);
    for_each_word_enum_cb_ctx ctx;

    /* check arguments */
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* get a pointer to the callback value, but leave it on the stack */
    cb_val = G_stk->get(0);

    /* push a self-reference for gc protection while we're working */
    G_stk->push()->set_obj(self);

    /* 
     *   enumerate the entries in our underlying hashtable - use the "safe"
     *   enumerator to ensure that we're insulated from any changes to the
     *   hashtable that the callback wants to make 
     */
    ctx.vmg = VMGLOB_ADDR;
    ctx.cb_val = cb_val;
    ctx.rc.init(vmg_ "Dict.forEachWord", self, 6, cb_val, orig_argc);
    get_ext()->hashtab_->safe_enum_entries(for_each_word_enum_cb, &ctx);

    /* discard arguments and gc protection */
    G_stk->discard(2);

    /* there's no return value */
    retval->set_nil();

    /* handled */
    return TRUE;
}